

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall BMRS_XZ<UFPC>::Dealloc(BMRS_XZ<UFPC> *this)

{
  Run *pRVar1;
  uint64_t *puVar2;
  
  if (UFPC::P_ != (uint *)0x0) {
    operator_delete__(UFPC::P_);
  }
  pRVar1 = (this->data_runs).runs;
  if (pRVar1 != (Run *)0x0) {
    operator_delete__(pRVar1);
  }
  puVar2 = (this->data_flags).bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->data_merged).bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
  }
  puVar2 = (this->data_compressed).bits;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete__(puVar2);
    return;
  }
  return;
}

Assistant:

void Dealloc() {
        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
        // No free for img_labels_ because it is required at the end of the algorithm 
    }